

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

bool __thiscall
perfetto::protos::gen::EnumDescriptorProto::operator==
          (EnumDescriptorProto *this,EnumDescriptorProto *other)

{
  size_t sVar1;
  pointer pEVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__last1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first2;
  bool bVar3;
  int iVar4;
  pointer other_00;
  pointer this_00;
  
  sVar1 = (this->unknown_fields_)._M_string_length;
  if (sVar1 == (other->unknown_fields_)._M_string_length) {
    if ((sVar1 != 0) &&
       (iVar4 = bcmp((this->unknown_fields_)._M_dataplus._M_p,
                     (other->unknown_fields_)._M_dataplus._M_p,sVar1), iVar4 != 0)) {
      return false;
    }
    sVar1 = (this->name_)._M_string_length;
    if (sVar1 == (other->name_)._M_string_length) {
      if ((sVar1 != 0) &&
         (iVar4 = bcmp((this->name_)._M_dataplus._M_p,(other->name_)._M_dataplus._M_p,sVar1),
         iVar4 != 0)) {
        return false;
      }
      this_00 = (this->value_).
                super__Vector_base<perfetto::protos::gen::EnumValueDescriptorProto,_std::allocator<perfetto::protos::gen::EnumValueDescriptorProto>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pEVar2 = (this->value_).
               super__Vector_base<perfetto::protos::gen::EnumValueDescriptorProto,_std::allocator<perfetto::protos::gen::EnumValueDescriptorProto>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      other_00 = (other->value_).
                 super__Vector_base<perfetto::protos::gen::EnumValueDescriptorProto,_std::allocator<perfetto::protos::gen::EnumValueDescriptorProto>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if ((long)pEVar2 - (long)this_00 ==
          (long)(other->value_).
                super__Vector_base<perfetto::protos::gen::EnumValueDescriptorProto,_std::allocator<perfetto::protos::gen::EnumValueDescriptorProto>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)other_00) {
        for (; this_00 != pEVar2; this_00 = this_00 + 1) {
          bVar3 = EnumValueDescriptorProto::operator==(this_00,other_00);
          if (!bVar3) {
            return false;
          }
          other_00 = other_00 + 1;
        }
        __first1 = (this->reserved_name_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        __last1 = (this->reserved_name_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        __first2 = (other->reserved_name_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        if ((long)__last1 - (long)__first1 ==
            (long)(other->reserved_name_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)__first2) {
          bVar3 = ::std::__equal<false>::
                  equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                            (__first1,__last1,__first2);
          return bVar3;
        }
      }
    }
  }
  return false;
}

Assistant:

T&& value() && {
    PERFETTO_CHECK(storage_.is_populated_);
    return std::move(storage_.value_);
  }